

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O2

void __thiscall
wasm::DataFlow::Trace::addPathTo
          (Trace *this,Expression *parent,Expression *curr,
          vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_> *conditions)

{
  long lVar1;
  Node *local_20;
  Node *condition;
  
  if (parent->_id != IfId) {
    handle_unreachable("invalid expr",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Souperify.cpp"
                       ,0x163);
  }
  if ((Expression *)parent[1].type.id == curr) {
    lVar1 = 0;
  }
  else {
    if (*(Expression **)(parent + 2) != curr) {
      handle_unreachable("invalid expr",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Souperify.cpp"
                         ,0x15a);
    }
    lVar1 = 1;
  }
  local_20 = (conditions->
             super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>).
             _M_impl.super__Vector_impl_data._M_start[lVar1];
  add(this,local_20,0);
  std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::push_back
            (&this->pathConditions,&local_20);
  return;
}

Assistant:

void addPathTo(Expression* parent,
                 Expression* curr,
                 std::vector<Node*> conditions) {
    if (auto* iff = parent->dynCast<If>()) {
      Index index;
      if (curr == iff->ifTrue) {
        index = 0;
      } else if (curr == iff->ifFalse) {
        index = 1;
      } else {
        WASM_UNREACHABLE("invalid expr");
      }
      auto* condition = conditions[index];
      // Add the condition itself as an instruction in the trace -
      // the pc uses it as its input.
      add(condition, 0);
      // Add it as a pc, which we will emit directly.
      pathConditions.push_back(condition);
    } else {
      WASM_UNREACHABLE("invalid expr");
    }
  }